

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref __thiscall cashew::ValueBuilder::makeDot(ValueBuilder *this,Ref obj,IString key)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  void *pvVar4;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = Value::setArray(pVVar2,3);
  pvVar4 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,pvVar4);
  (RVar3.inst)->type = String;
  pcVar1 = _finalize;
  ((RVar3.inst)->field_1).str.str._M_len = DOT;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = Value::push_back(pVVar2,RVar3);
  pVVar2 = Value::push_back(pVVar2,(Ref)this);
  pvVar4 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,pvVar4);
  (RVar3.inst)->type = String;
  ((RVar3.inst)->field_1).ref.inst = obj.inst;
  ((RVar3.inst)->field_1).str.str._M_str = (char *)key.str._M_len;
  RVar3.inst = Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeDot(Ref obj, IString key) {
    return &makeRawArray(3)
              ->push_back(makeRawString(DOT))
              .push_back(obj)
              .push_back(makeRawString(key));
  }